

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 24点.cpp
# Opt level: O3

bool jiesuan(int a,int b,int c,int d,string *cal)

{
  char cVar1;
  char cVar2;
  char cVar3;
  pointer pcVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  __string_type __str;
  string pos;
  undefined1 *local_118;
  ulong local_110;
  undefined1 local_108 [16];
  string *local_f8;
  long *local_f0;
  ulong local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  ulong local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_90[0] = local_80;
  local_f8 = cal;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"+-*/","");
  dVar11 = (double)a;
  dVar14 = (double)b;
  dVar12 = (double)c;
  dVar13 = (double)d;
  bVar10 = true;
  uVar6 = 0;
  do {
    cVar1 = local_90[0][uVar6];
    lVar8 = 0;
    do {
      cVar2 = local_90[0][lVar8];
      lVar9 = 0;
      do {
        dVar15 = dVar11 * dVar14;
        if (((cVar1 != '*') && (dVar15 = dVar11 + dVar14, cVar1 != '+')) &&
           (dVar15 = dVar11 - dVar14, cVar1 != '-')) {
          dVar15 = dVar11 / dVar14;
        }
        if (cVar2 == '*') {
          dVar15 = dVar15 * dVar12;
        }
        else if (cVar2 == '-') {
          dVar15 = dVar15 - dVar12;
        }
        else if (cVar2 == '+') {
          dVar15 = dVar15 + dVar12;
        }
        else {
          dVar15 = dVar15 / dVar12;
        }
        cVar3 = local_90[0][lVar9];
        if (cVar3 == '*') {
          dVar15 = dVar15 * dVar13;
        }
        else if (cVar3 == '-') {
          dVar15 = dVar15 - dVar13;
        }
        else if (cVar3 == '+') {
          dVar15 = dVar15 + dVar13;
        }
        else {
          dVar15 = dVar15 / dVar13;
        }
        if ((dVar15 == 24.0) && (!NAN(dVar15))) {
          pcVar4 = poker_dict_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)a + -1]._M_dataplus._M_p;
          local_118 = local_108;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,pcVar4,
                     pcVar4 + poker_dict_abi_cxx11_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)a + -1].
                              _M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_118,local_110,0,'\x01');
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_118,
                                      (ulong)poker_dict_abi_cxx11_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[(long)b + -1]
                                             ._M_dataplus._M_p);
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_e0 = *plVar7;
            lStack_d8 = plVar5[3];
            local_f0 = &local_e0;
          }
          else {
            local_e0 = *plVar7;
            local_f0 = (long *)*plVar5;
          }
          local_e8 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_f0,local_e8,0,'\x01');
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_c0 = *plVar7;
            lStack_b8 = plVar5[3];
            local_d0 = &local_c0;
          }
          else {
            local_c0 = *plVar7;
            local_d0 = (long *)*plVar5;
          }
          local_c8 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_d0,
                                      (ulong)poker_dict_abi_cxx11_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[(long)c + -1]
                                             ._M_dataplus._M_p);
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_a0 = *plVar7;
            lStack_98 = plVar5[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar7;
            local_b0 = (long *)*plVar5;
          }
          local_a8 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b0,local_a8,0,'\x01');
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_60 = *plVar7;
            lStack_58 = plVar5[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar7;
            local_70 = (long *)*plVar5;
          }
          local_68 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,
                                      (ulong)poker_dict_abi_cxx11_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[(long)d + -1]
                                             ._M_dataplus._M_p);
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_40 = *plVar7;
            lStack_38 = plVar5[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar7;
            local_50 = (long *)*plVar5;
          }
          local_48 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_f8,(string *)&local_50);
          if (local_50 != &local_40) {
            operator_delete(local_50);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0);
          }
          if (local_118 != local_108) {
            operator_delete(local_118);
          }
          goto LAB_00103a21;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    bVar10 = uVar6 < 3;
    uVar6 = uVar6 + 1;
    if (uVar6 == 4) {
      bVar10 = false;
LAB_00103a21:
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      return bVar10;
    }
  } while( true );
}

Assistant:

bool jiesuan(int a,int b,int c,int d, string &  cal)
{
    string pos="+-*/";
    for (int i=0;i<4;i++)
    {
        for (int j=0;j<4;j++)
        {
            for (int k=0;k<4;k++)
            {
               if (cal_24(cal_24(cal_24(a,pos[i],b),pos[j],c),pos[k],d) == 24.0000)
               {
                   cal = poker_dict[a-1]+pos[i]+poker_dict[b-1]+pos[j]+poker_dict[c-1]+pos[k]+poker_dict[d-1];
                   return true;
               } 
            }
        }
    }
    return false;
}